

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode connect_SOCKS(connectdata *conn,int sockindex,_Bool *done)

{
  ulong uVar1;
  CURLproxycode CVar2;
  CURLcode CVar3;
  uint remote_port;
  char *hostname;
  
  uVar1 = *(ulong *)&(conn->bits).field_0x4;
  if ((uVar1 & 2) == 0) {
    *done = true;
    return CURLE_OK;
  }
  if ((uVar1 & 1) != 0) {
    hostname = (conn->http_proxy).host.name;
    remote_port = (uint)(conn->http_proxy).port;
    goto LAB_0010e137;
  }
  if (((uint)uVar1 >> 8 & 1) == 0) {
    if (sockindex != 1) {
      hostname = (conn->host).name;
LAB_0010e123:
      if (((uint)uVar1 >> 9 & 1) == 0) {
        remote_port = conn->remote_port;
      }
      else {
        remote_port = conn->conn_to_port;
      }
      goto LAB_0010e137;
    }
    hostname = conn->secondaryhostname;
  }
  else {
    hostname = (conn->conn_to_host).name;
    if (sockindex != 1) goto LAB_0010e123;
  }
  remote_port = (uint)conn->secondary_port;
LAB_0010e137:
  switch((conn->socks_proxy).proxytype) {
  case CURLPROXY_SOCKS4:
  case CURLPROXY_SOCKS4A:
    CVar2 = Curl_SOCKS4((conn->socks_proxy).user,hostname,remote_port,sockindex,conn,done);
    break;
  case CURLPROXY_SOCKS5:
  case CURLPROXY_SOCKS5_HOSTNAME:
    CVar2 = Curl_SOCKS5((conn->socks_proxy).user,(conn->socks_proxy).passwd,hostname,remote_port,
                        sockindex,conn,done);
    break;
  default:
    Curl_failf(conn->data,"unknown proxytype option given");
    return CURLE_COULDNT_CONNECT;
  }
  if (CVar2 == CURLPX_OK) {
    CVar3 = CURLE_OK;
  }
  else {
    (conn->data->info).pxcode = CVar2;
    CVar3 = CURLE_PROXY;
  }
  return CVar3;
}

Assistant:

static CURLcode connect_SOCKS(struct connectdata *conn, int sockindex,
                              bool *done)
{
  CURLcode result = CURLE_OK;
#ifndef CURL_DISABLE_PROXY
  CURLproxycode pxresult = CURLPX_OK;
  if(conn->bits.socksproxy) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    const char * const host =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    const int port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    switch(conn->socks_proxy.proxytype) {
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      pxresult = Curl_SOCKS5(conn->socks_proxy.user, conn->socks_proxy.passwd,
                             host, port, sockindex, conn, done);
      break;

    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      pxresult = Curl_SOCKS4(conn->socks_proxy.user, host, port, sockindex,
                             conn, done);
      break;

    default:
      failf(conn->data, "unknown proxytype option given");
      result = CURLE_COULDNT_CONNECT;
    } /* switch proxytype */
    if(pxresult) {
      result = CURLE_PROXY;
      conn->data->info.pxcode = pxresult;
    }
  }
  else
#else
    (void)conn;
    (void)sockindex;
#endif /* CURL_DISABLE_PROXY */
    *done = TRUE; /* no SOCKS proxy, so consider us connected */

  return result;
}